

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

void __thiscall
google::protobuf::TextMarkerGenerator::PrintMarker
          (TextMarkerGenerator *this,BaseTextGenerator *generator,bool redact,bool randomize,
          bool single_line_mode)

{
  undefined7 in_register_00000011;
  
  if ((int)CONCAT71(in_register_00000011,redact) != 0) {
    (*generator->_vptr_BaseTextGenerator[5])
              (generator,(this->redaction_marker_)._M_str,(this->redaction_marker_)._M_len);
  }
  if (randomize) {
    (*generator->_vptr_BaseTextGenerator[5])
              (generator,(this->random_marker_)._M_str,(this->random_marker_)._M_len);
  }
  if (!redact && !randomize || single_line_mode) {
    return;
  }
  (*generator->_vptr_BaseTextGenerator[5])(generator,"\n",1);
  return;
}

Assistant:

void PrintMarker(TextFormat::BaseTextGenerator* generator, bool redact,
                   bool randomize, bool single_line_mode) const {
    if (redact) {
      generator->Print(redaction_marker_.data(), redaction_marker_.size());
    }
    if (randomize) {
      generator->Print(random_marker_.data(), random_marker_.size());
    }
    if ((redact || randomize) && !single_line_mode) {
      generator->PrintLiteral("\n");
    }
  }